

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.cc
# Opt level: O2

void __thiscall fasttext::Matrix::dump(Matrix *this,ostream *out)

{
  ostream *poVar1;
  long lVar2;
  int64_t j;
  long lVar3;
  long lVar4;
  int64_t i;
  long lVar5;
  
  poVar1 = std::ostream::_M_insert<long>((long)out);
  poVar1 = std::operator<<(poVar1," ");
  poVar1 = std::ostream::_M_insert<long>((long)poVar1);
  std::endl<char,std::char_traits<char>>(poVar1);
  lVar4 = 0;
  for (lVar5 = 0; lVar5 < this->m_; lVar5 = lVar5 + 1) {
    for (lVar3 = 0; lVar2 = this->n_, lVar3 < lVar2; lVar3 = lVar3 + 1) {
      if (lVar3 != 0) {
        std::operator<<(out," ");
        lVar2 = this->n_;
      }
      std::ostream::operator<<
                (out,*(float *)((long)(this->data_).
                                      super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                      super__Vector_impl_data._M_start + lVar3 * 4 + lVar2 * lVar4))
      ;
    }
    std::endl<char,std::char_traits<char>>(out);
    lVar4 = lVar4 + 4;
  }
  return;
}

Assistant:

void Matrix::dump(std::ostream& out) const {
  out << m_ << " " << n_ << std::endl;
  for (int64_t i = 0; i < m_; i++) {
    for (int64_t j = 0; j < n_; j++) {
      if (j > 0) {
        out << " ";
      }
      out << at(i, j);
    }
    out << std::endl;
  }
}